

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O0

void aom_internal_error(aom_internal_error_info *info,aom_codec_err_t error,char *fmt,...)

{
  aom_internal_error_info *in_RCX;
  int *in_RDI;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  aom_codec_err_t in_stack_ffffffffffffff2c;
  
  set_error(in_RCX,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (in_RDI[0x34] != 0) {
    longjmp((__jmp_buf_tag *)(in_RDI + 0x36),*in_RDI);
  }
  return;
}

Assistant:

void aom_internal_error(struct aom_internal_error_info *info,
                        aom_codec_err_t error, const char *fmt, ...) {
  va_list ap;

  va_start(ap, fmt);
  set_error(info, error, fmt, ap);
  va_end(ap);

  if (info->setjmp) longjmp(info->jmp, info->error_code);
}